

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::LoadStringConstant(VirtualMachine *this)

{
  element_type *peVar1;
  element_type *peVar2;
  size_t __n;
  const_reference val;
  string local_40;
  allocator<char> local_19;
  
  __n = getByteCodeParameter(this);
  peVar1 = (this->file).super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (__n < (ulong)((long)(peVar1->stringConstants).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(peVar1->stringConstants).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    val = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at(&peVar1->stringConstants,__n);
    pushString(this,val);
    peVar2 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar2->programCounter = peVar2->programCounter + 1;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Index out of bounds in LoadStringConstant",&local_19);
  panic(this,&local_40);
}

Assistant:

void runtime::VirtualMachine::LoadStringConstant() {
  std::size_t index = this->getByteCodeParameter();

  if (index >= this->file->stringConstants.size()) {
    this->panic("Index out of bounds in LoadStringConstant");
    return;
  }

  this->pushString(&this->file->stringConstants.at(index));

  this->advance();
}